

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible
               (ON_NurbsCurve *nurbs_curveA,ON_NurbsCurve *nurbs_curveB)

{
  double *pdVar1;
  ON_Interval *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ON_NurbsCurve *pOVar14;
  ON_NurbsCurve *this_00;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ON_Interval span;
  ON_Interval local_40;
  
  this_00 = nurbs_curveA;
  pOVar14 = nurbs_curveB;
  if (nurbs_curveB->m_order < nurbs_curveA->m_order) {
    this_00 = nurbs_curveB;
    pOVar14 = nurbs_curveA;
  }
  iVar3 = (*(pOVar14->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
  ON_NurbsCurve::IncreaseDegree(this_00,iVar3);
  if (nurbs_curveA->m_order == nurbs_curveB->m_order) {
    (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (nurbs_curveA);
    (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (nurbs_curveB);
    dVar16 = ON_Interval::Length(&span);
    dVar17 = ON_Interval::Length(&local_40);
    pOVar14 = nurbs_curveB;
    this = &span;
    if (dVar16 < dVar17) {
      pOVar14 = nurbs_curveA;
      this = &local_40;
    }
    uVar15 = 0;
    pdVar9 = ON_Interval::operator[](this,0);
    dVar16 = *pdVar9;
    pdVar9 = ON_Interval::operator[](this,1);
    iVar3 = (*(pOVar14->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                      (dVar16,*pdVar9,pOVar14);
    if ((char)iVar3 == '\0') goto LAB_00559f22;
    iVar3 = nurbs_curveA->m_order;
    ON_Interval::ON_Interval(&span);
    iVar4 = ON_NurbsCurve::KnotCount(nurbs_curveA);
    iVar5 = ON_NurbsCurve::KnotCount(nurbs_curveB);
    iVar6 = (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35]
            )();
    if (((char)iVar6 == '\0') &&
       (iVar6 = (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                  [0x35])(), (char)iVar6 == '\0')) {
LAB_00559ba4:
      bVar2 = ON_NurbsCurve::ClampEnd(nurbs_curveA,2);
      if ((!bVar2) || (bVar2 = ON_NurbsCurve::ClampEnd(nurbs_curveB,2), !bVar2)) goto LAB_00559f1f;
    }
    else {
      bVar2 = true;
      lVar13 = 0;
      while ((lVar13 < (long)iVar3 + -2 && (bVar2))) {
        dVar16 = nurbs_curveA->m_knot[lVar13];
        pdVar9 = nurbs_curveB->m_knot + lVar13;
        if (dVar16 != *pdVar9) {
          bVar2 = false;
        }
        if (NAN(dVar16) || NAN(*pdVar9)) {
          bVar2 = false;
        }
        lVar13 = lVar13 + 1;
      }
      lVar13 = (long)nurbs_curveA->m_cv_count;
      for (iVar6 = nurbs_curveB->m_cv_count; (lVar13 < iVar4 && (iVar6 < iVar5)); iVar6 = iVar6 + 1)
      {
        if (!bVar2) goto LAB_00559ba4;
        dVar16 = nurbs_curveA->m_knot[lVar13];
        pdVar9 = nurbs_curveB->m_knot + lVar13;
        if (dVar16 != *pdVar9) {
          bVar2 = false;
        }
        if (NAN(dVar16) || NAN(*pdVar9)) {
          bVar2 = false;
        }
        lVar13 = lVar13 + 1;
      }
      if (!bVar2) goto LAB_00559ba4;
    }
    iVar6 = iVar3 + -1;
    iVar5 = (iVar4 - (iVar3 * 2 + -2)) + iVar5;
    while( true ) {
      iVar4 = nurbs_curveA->m_cv_count;
      iVar7 = nurbs_curveB->m_cv_count;
      if ((iVar7 + -1 <= iVar6 && iVar4 + -1 <= iVar6) || (iVar4 <= iVar6)) break;
      pdVar9 = nurbs_curveA->m_knot;
      lVar13 = (long)iVar6;
      dVar16 = pdVar9[lVar13 + -1];
      dVar17 = nurbs_curveB->m_knot[lVar13 + -1];
      if ((dVar16 != dVar17) || ((NAN(dVar16) || NAN(dVar17) || (iVar7 <= iVar6)))) break;
      dVar19 = pdVar9[lVar13];
      if ((dVar19 == dVar16) && (!NAN(dVar19) && !NAN(dVar16))) goto LAB_00559f1f;
      dVar16 = nurbs_curveB->m_knot[lVar13];
      if ((dVar16 == dVar17) && (!NAN(dVar16) && !NAN(dVar17))) goto LAB_00559f1f;
      lVar11 = lVar13 + -1;
      iVar4 = ON_KnotMultiplicity(iVar3,iVar4,pdVar9,iVar6);
      iVar7 = ON_KnotMultiplicity(iVar3,nurbs_curveB->m_cv_count,nurbs_curveB->m_knot,iVar6);
      if (dVar16 <= dVar19) {
        if (dVar16 < dVar19) {
          ON_Interval::Set(&span,nurbs_curveA->m_knot[lVar11],nurbs_curveA->m_knot[lVar13]);
          dVar18 = ON_Interval::Length(&span);
          dVar17 = nurbs_curveA->m_knot[lVar11];
          dVar19 = nurbs_curveA->m_knot[lVar13];
          pdVar9 = ON_Interval::operator[](&span,1);
          if ((ABS(dVar19) + ABS(dVar17) + dVar18) * -1.490116119385e-08 + *pdVar9 <= dVar16) {
            pdVar9 = nurbs_curveA->m_knot;
            for (lVar11 = lVar13; lVar11 < iVar4 + iVar6; lVar11 = lVar11 + 1) {
              pdVar9[lVar11] = dVar16;
            }
          }
          else {
            ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,iVar5);
            ON_NurbsCurve::InsertKnot(nurbs_curveA,dVar16,iVar7);
          }
          dVar19 = nurbs_curveA->m_knot[lVar13];
          iVar4 = ON_KnotMultiplicity(iVar3,nurbs_curveA->m_cv_count,nurbs_curveA->m_knot,iVar6);
        }
      }
      else {
        ON_Interval::Set(&span,nurbs_curveB->m_knot[lVar11],nurbs_curveB->m_knot[lVar13]);
        dVar18 = ON_Interval::Length(&span);
        dVar16 = nurbs_curveB->m_knot[lVar11];
        dVar17 = nurbs_curveB->m_knot[lVar13];
        pdVar9 = ON_Interval::operator[](&span,1);
        if ((ABS(dVar17) + ABS(dVar16) + dVar18) * -1.490116119385e-08 + *pdVar9 <= dVar19) {
          pdVar9 = nurbs_curveB->m_knot;
          for (lVar11 = lVar13; lVar11 < iVar7 + iVar6; lVar11 = lVar11 + 1) {
            pdVar9[lVar11] = dVar19;
          }
        }
        else {
          ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,iVar5);
          ON_NurbsCurve::InsertKnot(nurbs_curveB,dVar19,iVar4);
        }
        dVar16 = nurbs_curveB->m_knot[lVar13];
        iVar7 = ON_KnotMultiplicity(iVar3,nurbs_curveB->m_cv_count,nurbs_curveB->m_knot,iVar6);
      }
      if ((dVar19 != dVar16) || (NAN(dVar19) || NAN(dVar16))) goto LAB_00559f1f;
      if (iVar4 < iVar7) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,iVar5);
        bVar2 = ON_NurbsCurve::InsertKnot(nurbs_curveA,dVar19,iVar7);
        iVar4 = iVar7;
LAB_00559eea:
        if (bVar2 == false) goto LAB_00559f1f;
      }
      else if (iVar7 < iVar4) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,iVar5);
        bVar2 = ON_NurbsCurve::InsertKnot(nurbs_curveB,dVar19,iVar4);
        goto LAB_00559eea;
      }
      iVar6 = iVar6 + iVar4;
    }
    uVar15 = 0;
    if (iVar4 == iVar7) {
      uVar8 = ON_NurbsCurve::KnotCount(nurbs_curveA);
      uVar10 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar10 = uVar15;
      }
      uVar12 = 0;
      while (uVar15 = (ulong)(uVar10 == uVar12), uVar10 != uVar12) {
        pdVar9 = nurbs_curveA->m_knot + uVar12;
        pdVar1 = nurbs_curveB->m_knot + uVar12;
        uVar12 = uVar12 + 1;
        if ((*pdVar9 != *pdVar1) || (NAN(*pdVar9) || NAN(*pdVar1))) break;
      }
    }
  }
  else {
LAB_00559f1f:
    uVar15 = 0;
  }
LAB_00559f22:
  return SUB81(uVar15,0);
}

Assistant:

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible(
       ON_NurbsCurve& nurbs_curveA,
       ON_NurbsCurve& nurbs_curveB
       )
{
  if ( !ON_MakeDegreesCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;
  if ( !ON_MakeDomainsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  const int order = nurbs_curveA.m_order;
  ON_Interval span;
  double ktol, a, b;
  int i, ki, multA, multB;
  int knot_countA = nurbs_curveA.KnotCount();
  int knot_countB = nurbs_curveB.KnotCount();
  int max_knot_capacity = knot_countA + knot_countB - 2*(order-1);

  bool bPeriodic = false;
  if ( nurbs_curveA.IsPeriodic() || nurbs_curveB.IsPeriodic() )
  {
    bPeriodic = true;
    for ( ki = 0; ki < order-2 && bPeriodic; ki++ )
    {
      if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
        bPeriodic = false;
    }
    int kiA, kiB;
    for (
      kiA = nurbs_curveA.m_cv_count,
      kiB = nurbs_curveB.m_cv_count;
      kiA < knot_countA && kiB < knot_countB && bPeriodic;
      kiA++, kiB++ )
    {
      if ( nurbs_curveA.m_knot[kiA] != nurbs_curveB.m_knot[kiA] )
        bPeriodic = false;
    }
  }
  if ( !bPeriodic )
  {
    if ( !nurbs_curveA.ClampEnd(2) )
      return false;
    if ( !nurbs_curveB.ClampEnd(2) )
      return false;
  }

  ki = order-1; 
  while ( (ki < nurbs_curveA.m_cv_count-1 || ki < nurbs_curveB.m_cv_count-1)
          && nurbs_curveA.m_knot[ki-1] == nurbs_curveB.m_knot[ki-1]
          && ki <= nurbs_curveA.m_cv_count-1
          && ki <= nurbs_curveB.m_cv_count-1
          )
  {
    a = nurbs_curveA.m_knot[ki];
    if ( a == nurbs_curveA.m_knot[ki-1] )
      return false;
    b = nurbs_curveB.m_knot[ki];
    if ( b == nurbs_curveB.m_knot[ki-1] )
      return false;
    multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );

    if ( a < b )
    {
      // insert a in nurbs_curveB
      span.Set(nurbs_curveB.m_knot[ki-1], nurbs_curveB.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveB.m_knot[ki-1]) + fabs(nurbs_curveB.m_knot[ki]) );
      if ( a >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multB; i++ )
          nurbs_curveB.m_knot[i] = a;          
      }
      else
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveB.InsertKnot( a, multA );
      }
      b = nurbs_curveB.m_knot[ki];
      multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );
    }
    else if ( b < a )
    {
      // insert b in nurbs_curveA
      span.Set(nurbs_curveA.m_knot[ki-1], nurbs_curveA.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveA.m_knot[ki-1]) + fabs(nurbs_curveA.m_knot[ki]) );
      if ( b >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multA; i++ )
          nurbs_curveA.m_knot[i] = b;
      }
      else
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveA.InsertKnot( b, multB );
      }
      a = nurbs_curveA.m_knot[ki];
      multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    }

    if ( a != b )
      return false;

    if ( a == b )
    {
      if ( multA < multB )
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveA.InsertKnot( a, multB ) )
          return false;
        multA = multB;
      }
      else if ( multB < multA )
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveB.InsertKnot( a, multA ) )
          return false;
        multB = multA;
      }
      ki += multA;
    }
  }

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return false;
  knot_countA = nurbs_curveA.KnotCount();
  for ( ki = 0; ki < knot_countA; ki++ )
  {
    if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
      return false;
  }

  return true;
}